

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O2

void InitParametersFromDefinitions
               (InternalEffectDefinitionRegistrationCallback registereffectdefcallback,float *params
               )

{
  UInt32 n;
  ulong uVar1;
  long lVar2;
  UnityAudioEffectDefinition definition;
  
  memset(&definition,0,0x88);
  (*registereffectdefcallback)(&definition);
  lVar2 = 0xc;
  for (uVar1 = 0; uVar1 < definition.numparameters; uVar1 = uVar1 + 1) {
    params[uVar1] = *(float *)((definition.paramdefs)->name + lVar2 * 4);
    if (*(void **)((definition.paramdefs)->name + lVar2 * 4 + -0x10) != (void *)0x0) {
      operator_delete__(*(void **)((definition.paramdefs)->name + lVar2 * 4 + -0x10));
    }
    lVar2 = lVar2 + 0x10;
  }
  if (definition.paramdefs != (UnityAudioParameterDefinition *)0x0) {
    operator_delete__(definition.paramdefs);
  }
  return;
}

Assistant:

void InitParametersFromDefinitions(
    InternalEffectDefinitionRegistrationCallback registereffectdefcallback,
    float* params
    )
{
    UnityAudioEffectDefinition definition;
    memset(&definition, 0, sizeof(definition));
    registereffectdefcallback(definition);
    for (UInt32 n = 0; n < definition.numparameters; n++)
    {
        params[n] = definition.paramdefs[n].defaultval;
        delete[] definition.paramdefs[n].description;
    }
    delete[] definition.paramdefs; // assumes that definition.paramdefs was allocated by registereffectdefcallback or is NULL
}